

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

string * typeToString_abi_cxx11_(string *__return_storage_ptr__,HighsVarType type)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    pcVar2 = "Continuous";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Integer   ";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Semi-conts";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Semi-int  ";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "ImpliedInt";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string typeToString(const HighsVarType type) {
  switch (type) {
    case HighsVarType::kContinuous:
      return "Continuous";
    case HighsVarType::kInteger:
      return "Integer   ";
    case HighsVarType::kSemiContinuous:
      return "Semi-conts";
    case HighsVarType::kSemiInteger:
      return "Semi-int  ";
    case HighsVarType::kImplicitInteger:
      return "ImpliedInt";
  }
  return "";
}